

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_exponent<char,fmt::v11::basic_appender<char>>
          (int exp,basic_appender<char> out)

{
  basic_appender<char> this;
  buffer<char> *in_RSI;
  uint in_EDI;
  char *d;
  char *top;
  uint32_t uexp;
  char c;
  basic_appender<char> in_stack_ffffffffffffffa0;
  basic_appender<char> local_58;
  char *local_50;
  basic_appender<char> local_48;
  basic_appender<char> local_40;
  char *local_38;
  uint local_2c;
  basic_appender<char> local_28;
  basic_appender<char> local_20;
  bool local_15;
  uint local_14;
  basic_appender<char> local_10 [2];
  
  c = -10000 < (int)in_EDI && (int)in_EDI < 10000;
  local_15 = (bool)c;
  local_14 = in_EDI;
  local_10[0].container = in_RSI;
  ignore_unused<bool,char[22]>(&local_15,(char (*) [22])"exponent out of range");
  if ((int)local_14 < 0) {
    local_20 = basic_appender<char>::operator++(local_10,0);
    basic_appender<char>::operator*(&local_20);
    basic_appender<char>::operator=((basic_appender<char> *)in_stack_ffffffffffffffa0.container,c);
    local_14 = -local_14;
  }
  else {
    local_28 = basic_appender<char>::operator++(local_10,0);
    basic_appender<char>::operator*(&local_28);
    basic_appender<char>::operator=((basic_appender<char> *)in_stack_ffffffffffffffa0.container,c);
  }
  local_2c = local_14;
  if (99 < local_14) {
    local_38 = digits2((ulong)local_14 / 100);
    if (999 < local_2c) {
      local_40 = basic_appender<char>::operator++(local_10,0);
      basic_appender<char>::operator*(&local_40);
      basic_appender<char>::operator=((basic_appender<char> *)in_stack_ffffffffffffffa0.container,c)
      ;
    }
    local_48 = basic_appender<char>::operator++(local_10,0);
    basic_appender<char>::operator*(&local_48);
    basic_appender<char>::operator=((basic_appender<char> *)in_stack_ffffffffffffffa0.container,c);
    local_2c = local_2c % 100;
  }
  local_50 = digits2((ulong)local_2c);
  local_58 = basic_appender<char>::operator++(local_10,0);
  basic_appender<char>::operator*(&local_58);
  basic_appender<char>::operator=((basic_appender<char> *)in_stack_ffffffffffffffa0.container,c);
  this = basic_appender<char>::operator++(local_10,0);
  basic_appender<char>::operator*((basic_appender<char> *)&stack0xffffffffffffffa0);
  basic_appender<char>::operator=((basic_appender<char> *)this.container,c);
  return (basic_appender<char>)local_10[0].container;
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, OutputIt out) -> OutputIt {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *out++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *out++ = static_cast<Char>('+');
  }
  auto uexp = static_cast<uint32_t>(exp);
  if (is_constant_evaluated()) {
    if (uexp < 10) *out++ = '0';
    return format_decimal<Char>(out, uexp, count_digits(uexp));
  }
  if (uexp >= 100u) {
    const char* top = digits2(uexp / 100);
    if (uexp >= 1000u) *out++ = static_cast<Char>(top[0]);
    *out++ = static_cast<Char>(top[1]);
    uexp %= 100;
  }
  const char* d = digits2(uexp);
  *out++ = static_cast<Char>(d[0]);
  *out++ = static_cast<Char>(d[1]);
  return out;
}